

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartitioningAroundMedoids.h
# Opt level: O1

void __thiscall
CPartitioningAroundMedois<CDissimilarityMatrix<float>_>::AddMedoid
          (CPartitioningAroundMedois<CDissimilarityMatrix<float>_> *this,size_t medoid)

{
  unsigned_long *puVar1;
  iterator __position;
  pointer __s;
  pointer puVar2;
  DissimilarityMatrixType *pDVar3;
  ulong uVar4;
  size_t object;
  DistanceType DVar5;
  size_t local_20;
  float local_14;
  
  local_20 = medoid;
  if (Building < this->state) {
    __assert_fail("State() == Initializing || State() == Building",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/al-pacino[P]Clustering/src_nothreads/PartitioningAroundMedoids.h"
                  ,0x59,
                  "void CPartitioningAroundMedois<CDissimilarityMatrix<float>>::AddMedoid(size_t) [DISSIMILARITY_MATRIX_TYPE = CDissimilarityMatrix<float>]"
                 );
  }
  if (this->matrix->size <= medoid) {
    __assert_fail("medoid < NumberOfObjects()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/al-pacino[P]Clustering/src_nothreads/PartitioningAroundMedoids.h"
                  ,0x5a,
                  "void CPartitioningAroundMedois<CDissimilarityMatrix<float>>::AddMedoid(size_t) [DISSIMILARITY_MATRIX_TYPE = CDissimilarityMatrix<float>]"
                 );
  }
  puVar1 = (this->medoids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  __position._M_current =
       (this->medoids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((this->state != Initializing) == (puVar1 == __position._M_current)) {
    __assert_fail("medoids.empty() == ( State() == Initializing )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/al-pacino[P]Clustering/src_nothreads/PartitioningAroundMedoids.h"
                  ,0x5b,
                  "void CPartitioningAroundMedois<CDissimilarityMatrix<float>>::AddMedoid(size_t) [DISSIMILARITY_MATRIX_TYPE = CDissimilarityMatrix<float>]"
                 );
  }
  if ((ulong)((long)__position._M_current - (long)puVar1 >> 3) < this->numberOfClusters) {
    if (__position._M_current ==
        (this->medoids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->medoids,__position,
                 &local_20);
    }
    else {
      *__position._M_current = medoid;
      (this->medoids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    if (this->state == Initializing) {
      __s = (this->objectMedoids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
      puVar2 = (this->objectMedoids).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (__s != puVar2) {
        memset(__s,0,((long)puVar2 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
      }
      this->state = Building;
    }
    else {
      pDVar3 = this->matrix;
      uVar4 = pDVar3->size;
      if (uVar4 != 0) {
        object = 0;
        do {
          if (object != (this->objectMedoids).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[object]) {
            if (uVar4 <= local_20) {
              __assert_fail("i < size && j < size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/al-pacino[P]Clustering/src_nothreads/DissimilarityMatrix.h"
                            ,0x19,
                            "DistanceType CDissimilarityMatrix<float>::Distance(size_t, size_t) const [DISTANCE_TYPE = float]"
                           );
            }
            local_14 = (pDVar3->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar4 * object + local_20];
            DVar5 = distanceToMedoid(this,object);
            if (local_14 < DVar5) {
              (this->objectMedoids).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[object] = local_20;
            }
          }
          object = object + 1;
          pDVar3 = this->matrix;
          uVar4 = pDVar3->size;
        } while (object < uVar4);
      }
      if ((long)(this->medoids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->medoids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 == this->numberOfClusters) {
        this->state = Swapping;
        findObjectMedoids(this);
      }
    }
    return;
  }
  __assert_fail("medoids.size() < NumberOfClusters()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/al-pacino[P]Clustering/src_nothreads/PartitioningAroundMedoids.h"
                ,0x5c,
                "void CPartitioningAroundMedois<CDissimilarityMatrix<float>>::AddMedoid(size_t) [DISSIMILARITY_MATRIX_TYPE = CDissimilarityMatrix<float>]"
               );
}

Assistant:

void CPartitioningAroundMedois<DMT>::AddMedoid( size_t medoid )
{
	assert( State() == Initializing || State() == Building );
	assert( medoid < NumberOfObjects() );
	assert( medoids.empty() == ( State() == Initializing ) );
	assert( medoids.size() < NumberOfClusters() );

	medoids.push_back( medoid );

	if( State() == Initializing ) {
		fill( objectMedoids.begin(), objectMedoids.end(), 0 );
		state = Building;
	} else {
		// calculate new objectMedoids
		for( size_t object = 0; object < NumberOfObjects(); object++ ) {
			if( IsMedoid( object ) ) {
				continue; // if object is medoid
			}

			if( matrix.Distance( object, medoid ) < distanceToMedoid( object ) ) {
				objectMedoids[object] = medoid;
			}
		}

		if( medoids.size() == NumberOfClusters() ) {
			state = Swapping;

			findObjectMedoids();
		}
	}
}